

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_handle_end_of_early_data(ptls_t *tls,ptls_iovec_t message)

{
  ptls_key_schedule_t *ppVar1;
  int iVar2;
  size_t sVar3;
  ptls_hash_context_t **pppVar4;
  
  iVar2 = commission_handshake_secret(tls);
  if (iVar2 == 0) {
    ppVar1 = tls->key_schedule;
    if (ppVar1->num_hashes != 0) {
      pppVar4 = &ppVar1->hashes[0].ctx;
      sVar3 = 0;
      do {
        (*(*pppVar4)->update)(*pppVar4,message.base,message.len);
        sVar3 = sVar3 + 1;
        pppVar4 = pppVar4 + 2;
      } while (sVar3 != ppVar1->num_hashes);
    }
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    iVar2 = 0x202;
  }
  return iVar2;
}

Assistant:

static int server_handle_end_of_early_data(ptls_t *tls, ptls_iovec_t message)
{
    int ret;

    if ((ret = commission_handshake_secret(tls)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    return ret;
}